

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewChange.h
# Opt level: O1

void __thiscall
NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::AddOldVersion(NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *this,string *name,string *fileString,string *hashName)

{
  char cVar1;
  long *plVar2;
  Logger *pLVar3;
  ostream *poVar4;
  size_type *psVar5;
  string folderPath;
  ofstream file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long *local_230;
  filebuf local_228 [8];
  long local_220 [29];
  ios_base local_138 [264];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,(this->path->_M_dataplus)._M_p,(allocator<char> *)&local_270);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_230);
  psVar5 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_2b0.field_2._M_allocated_capacity = *psVar5;
    local_2b0.field_2._8_8_ = plVar2[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = *psVar5;
    local_2b0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_2b0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_230 != local_220) {
    operator_delete(local_230,local_220[0] + 1);
  }
  std::operator+(&local_270,&local_2b0,hashName);
  std::ofstream::ofstream(&local_230,(string *)&local_270,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    pLVar3 = Logger::getInstance();
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_290,anon_var_dwarf_77e9,anon_var_dwarf_77e9 + 0x2f);
    Logger::LogError(pLVar3,&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
  }
  std::ios::widen((char)&local_230 + (char)local_230[-3]);
  std::ostream::put((char)&local_230);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(fileString->_M_dataplus)._M_p,fileString->_M_string_length);
  pLVar3 = Logger::getInstance();
  std::operator+(&local_250,anon_var_dwarf_7802,name);
  Logger::LogInformation(pLVar3,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + _VTT[-3] + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void AddOldVersion(string name, string fileString, string hashName) {
        string folderPath = string(this->path->data()) + "/versions/";

        ofstream file(folderPath + hashName);
        if (!file.is_open()) {
            Logger::getInstance()->LogError("Ошибка при открытии файла");
        }
        file << endl << fileString;
        Logger::getInstance()->LogInformation("Добавена версия файла " + name);
    }